

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

float __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<float>::genRandom
          (DefaultSampling<float> *this,FloatFormat *format,Precision param_2,Random *rnd)

{
  int iVar1;
  int iVar2;
  YesNoMaybe YVar3;
  int exponent;
  int iVar4;
  deUint64 dVar5;
  float fVar6;
  double dVar7;
  double max;
  float local_a8;
  float local_a0;
  double local_78;
  deUint64 intFraction;
  float local_60;
  float significand;
  float quantum;
  float base;
  int exp;
  int fractionBits;
  double maxRoot;
  double minRoot;
  bool haveSubnormal;
  int maxExp;
  int minExp;
  Random *rnd_local;
  Precision param_2_local;
  FloatFormat *format_local;
  DefaultSampling<float> *this_local;
  
  iVar1 = tcu::FloatFormat::getMinExp(format);
  iVar2 = tcu::FloatFormat::getMaxExp(format);
  YVar3 = tcu::FloatFormat::hasSubnormal(format);
  local_78 = 1.0;
  if (YVar3 == NO) {
    local_78 = 0.0;
  }
  dVar7 = deCbrt(((double)iVar1 - 0.5) - local_78);
  max = deCbrt((double)iVar2 + 0.5);
  iVar2 = tcu::FloatFormat::getFractionBits(format);
  dVar7 = de::Random::getDouble(rnd,dVar7,max);
  dVar7 = dePow(dVar7,3.0);
  dVar7 = deRoundEven(dVar7);
  exponent = (int)dVar7;
  iVar4 = de::Random::getInt(rnd,0,0x40);
  switch(iVar4) {
  case 0:
    this_local._4_4_ = 0.0;
    break;
  case 1:
    this_local._4_4_ = std::numeric_limits<float>::infinity();
    break;
  case 2:
    fVar6 = std::numeric_limits<float>::infinity();
    this_local._4_4_ = -fVar6;
    break;
  case 3:
    this_local._4_4_ = std::numeric_limits<float>::quiet_NaN();
    break;
  default:
    if (exponent < iVar1) {
      significand = 0.0;
      local_60 = deFloatLdExp(1.0,iVar1 - iVar2);
    }
    else {
      significand = deFloatLdExp(1.0,exponent);
      local_60 = deFloatLdExp(1.0,exponent - iVar2);
    }
    iVar1 = de::Random::getInt(rnd,0,0x10);
    if (iVar1 == 0) {
      intFraction._4_4_ = significand - local_60;
    }
    else if (iVar1 == 1) {
      intFraction._4_4_ = local_60;
    }
    else if (iVar1 == 2) {
      intFraction._4_4_ = 0.0;
    }
    else {
      dVar5 = de::Random::getUint64(rnd);
      base._0_1_ = (byte)iVar2;
      local_a0 = (float)(dVar5 & (long)((1 << (base._0_1_ & 0x1f)) + -1));
      intFraction._4_4_ = local_a0 * local_60;
    }
    iVar1 = de::Random::getInt(rnd,0,3);
    local_a8 = -1.0;
    if (iVar1 != 0) {
      local_a8 = 1.0;
    }
    this_local._4_4_ = local_a8 * (significand + intFraction._4_4_);
  }
  return this_local._4_4_;
}

Assistant:

float DefaultSampling<float>::genRandom (const FloatFormat& format,
										 Precision,
										 Random&			rnd) const
{
	const int		minExp			= format.getMinExp();
	const int		maxExp			= format.getMaxExp();
	const bool		haveSubnormal	= format.hasSubnormal() != tcu::NO;

	// Choose exponent so that the cumulative distribution is cubic.
	// This makes the probability distribution quadratic, with the peak centered on zero.
	const double	minRoot			= deCbrt(minExp - 0.5 - (haveSubnormal ? 1.0 : 0.0));
	const double	maxRoot			= deCbrt(maxExp + 0.5);
	const int		fractionBits	= format.getFractionBits();
	const int		exp				= int(deRoundEven(dePow(rnd.getDouble(minRoot, maxRoot),
															3.0)));
	float			base			= 0.0f; // integral power of two
	float			quantum			= 0.0f; // smallest representable difference in the binade
	float			significand		= 0.0f; // Significand.

	DE_ASSERT(fractionBits < std::numeric_limits<float>::digits);

	// Generate some occasional special numbers
	switch (rnd.getInt(0, 64))
	{
		case 0:		return 0;
		case 1:		return TCU_INFINITY;
		case 2:		return -TCU_INFINITY;
		case 3:		return TCU_NAN;
		default:	break;
	}

	if (exp >= minExp)
	{
		// Normal number
		base = deFloatLdExp(1.0f, exp);
		quantum = deFloatLdExp(1.0f, exp - fractionBits);
	}
	else
	{
		// Subnormal
		base = 0.0f;
		quantum = deFloatLdExp(1.0f, minExp - fractionBits);
	}

	switch (rnd.getInt(0, 16))
	{
		case 0: // The highest number in this binade, significand is all bits one.
			significand = base - quantum;
			break;
		case 1: // Significand is one.
			significand = quantum;
			break;
		case 2: // Significand is zero.
			significand = 0.0;
			break;
		default: // Random (evenly distributed) significand.
		{
			deUint64 intFraction = rnd.getUint64() & ((1 << fractionBits) - 1);
			significand = float(intFraction) * quantum;
		}
	}

	// Produce positive numbers more often than negative.
	return (rnd.getInt(0,3) == 0 ? -1.0f : 1.0f) * (base + significand);
}